

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O2

PriceCI * __thiscall
MonteCarloPricer::price<AsianArithmeticPut>
          (PriceCI *__return_storage_ptr__,MonteCarloPricer *this,BlackScholesModel *model,
          AsianArithmeticPut *option)

{
  int i;
  int iVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong extraout_XMM0_Qb;
  double dVar5;
  double dVar6;
  double local_50;
  double local_48;
  ulong uStack_40;
  double local_38;
  
  local_50 = Option::getMaturity((Option *)option);
  BlackScholesModel::generatePath(model,&local_50,this->prices_vector);
  dVar6 = 0.0;
  dVar5 = 0.0;
  for (iVar1 = 0; iVar1 < this->num_sims; iVar1 = iVar1 + 1) {
    local_50 = Option::getMaturity((Option *)option);
    BlackScholesModel::generatePath(model,&local_50,this->prices_vector);
    (*(option->super_PathDependentOption).super_Option._vptr_Option[1])(option,this->prices_vector);
    dVar6 = dVar6 + extraout_XMM0_Qa;
    dVar5 = dVar5 + extraout_XMM0_Qa * extraout_XMM0_Qa;
  }
  dVar2 = (double)this->num_sims;
  dVar6 = dVar6 / dVar2;
  local_48 = BlackScholesModel::getRiskFreeRate(model);
  local_48 = -local_48;
  uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
  dVar3 = Option::getMaturity((Option *)option);
  local_50 = exp(dVar3 * local_48);
  local_50 = local_50 * dVar6;
  dVar3 = BlackScholesModel::getRiskFreeRate(model);
  dVar4 = Option::getMaturity((Option *)option);
  local_38 = exp(dVar4 * dVar3 * -2.0);
  local_38 = local_38 * (dVar5 / dVar2 - dVar6 * dVar6);
  PriceCI::PriceCI(__return_storage_ptr__,&local_50,&local_38,&this->num_sims);
  return __return_storage_ptr__;
}

Assistant:

inline PriceCI MonteCarloPricer::price(BlackScholesModel const& model, T const& option)
{
	model.generatePath(option.getMaturity(), *prices_vector);

	double payoff, payoff_sum = 0.0, payoff_sq_mean = 0.0;
	for (int i = 0; i < num_sims; i++) {
		model.generatePath(option.getMaturity(), *prices_vector);
		payoff = option.payoff(*prices_vector);
		payoff_sum += payoff;
		payoff_sq_mean += payoff * payoff;
	}
	double payoff_mean = payoff_sum / static_cast<double>(num_sims);
	double payoff_std = (payoff_sq_mean / static_cast<double>(num_sims)) - payoff_mean * payoff_mean;
	payoff_mean *= exp(-model.getRiskFreeRate() * option.getMaturity());
	payoff_std *= exp(-2 * model.getRiskFreeRate() * option.getMaturity());
	return { payoff_mean, payoff_std, num_sims };
}